

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

ggml_tensor * __thiscall llm_graph_context::build_inp_pos(llm_graph_context *this)

{
  tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_> tVar1;
  long lVar2;
  pointer *__ptr;
  bool bVar3;
  __uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_28;
  
  bVar3 = this->arch == LLM_ARCH_QWEN2VL;
  tVar1.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
  super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       operator_new(0x18);
  *(undefined ***)
   tVar1.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
   super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl = &PTR__llm_graph_input_i_00286900
  ;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8) = 0;
  *(ulong *)((long)tVar1.
                   super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                   .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10) =
       (ulong)bVar3 * 3 + 1;
  lVar2 = ggml_new_tensor_1d(this->ctx0,0x1a,(long)this->n_tokens << bVar3 * '\x02');
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8) = lVar2;
  ggml_set_input(lVar2);
  local_28._M_t.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       tVar1.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
       super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
  ::emplace_back<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>
            ((vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
              *)&((this->res)._M_t.
                  super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>
                  .super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->inputs,
             (unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)&local_28);
  if ((_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
      local_28._M_t.
      super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
      super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8))();
  }
  return *(ggml_tensor **)
          ((long)tVar1.
                 super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                 .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8);
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_pos() const {
    auto inp = std::make_unique<llm_graph_input_pos>(n_pos_per_token());

    auto & cur = inp->pos;

    cur = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, n_tokens*n_pos_per_token());
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}